

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>::Clear
          (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *this)

{
  Type pRVar1;
  SListNodeBase<Memory::Recycler> *pSVar2;
  bool bVar3;
  WriteBarrierPtr *pWVar4;
  SListNodeBase<Memory::Recycler> **ppSVar5;
  long *plVar6;
  long extraout_RDX;
  code *local_60;
  SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *this_local;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  pRVar1 = this->allocator;
  pWVar4 = (WriteBarrierPtr *)
           SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)this);
  ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__(pWVar4);
  next = *ppSVar5;
  while (bVar3 = SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>::IsHead
                           (&this->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>
                            ,next), ((bVar3 ^ 0xffU) & 1) != 0) {
    pWVar4 = (WriteBarrierPtr *)SListNodeBase<Memory::Recycler>::Next(next);
    ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__(pWVar4);
    pSVar2 = *ppSVar5;
    local_60 = (code *)Memory::_RecyclerAllocatorFunc<Memory::_RecyclerWriteBarrierPolicy>::
                       GetFreeFunc();
    plVar6 = (long *)((long)&pRVar1->Cookie + extraout_RDX);
    if (((ulong)local_60 & 1) != 0) {
      local_60 = *(code **)(local_60 + *plVar6 + -1);
    }
    (*local_60)(plVar6,next,0x10);
    next = pSVar2;
  }
  SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>::Reset
            (&this->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>);
  return;
}

Assistant:

void Clear()
    {
        __super::Clear(allocator);
    }